

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall
lest::message::message(message *this,text *kind_,location *where_,text *expr_,text *note_)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)expr_);
  *(undefined ***)this = &PTR__message_0011dcd0;
  std::__cxx11::string::string((string *)&this->kind,kind_);
  location::location(&this->where,where_);
  std::__cxx11::string::string((string *)&bStack_48,note_);
  std::__cxx11::string::string((string *)&this->note,&bStack_48);
  std::__cxx11::string::~string((string *)&bStack_48);
  return;
}

Assistant:

message( text kind_, location where_, text expr_, text note_ = "" )
    : std::runtime_error( expr_), kind( kind_), where( where_), note( note_) {}